

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O1

void __thiscall fasttext::Dictionary::load(Dictionary *this,istream *in)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  entry e;
  undefined1 local_108 [160];
  vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> local_68;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::_M_erase_at_end
            (&this->words_,
             (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
             _M_impl.super__Vector_impl_data._M_start);
  memset((this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start,0xff,120000000);
  std::istream::read((char *)in,(long)&this->size_);
  std::istream::read((char *)in,(long)&this->nwords_);
  std::istream::read((char *)in,(long)&this->nlabels_);
  std::istream::read((char *)in,(long)&this->ntokens_);
  if (0 < this->size_) {
    iVar3 = 0;
    do {
      local_108._8_8_ = 0;
      local_108[0x10] = '\0';
      local_108._80_8_ = (pointer)0x0;
      local_108._88_8_ = (pointer)0x0;
      local_108._96_8_ = (pointer)0x0;
      local_108._104_8_ = (pointer)0x0;
      local_108._112_8_ = (pointer)0x0;
      local_108._48_8_ = (pointer)0x0;
      local_108._56_8_ = (pointer)0x0;
      local_108._64_8_ = (pointer)0x0;
      local_108._72_8_ = (pointer)0x0;
      local_108._120_8_ = local_108 + 0x88;
      local_108._128_8_ = 0;
      local_108[0x88] = '\0';
      local_68.super__Vector_base<fasttext::subentry,_std::allocator<fasttext::subentry>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_68.super__Vector_base<fasttext::subentry,_std::allocator<fasttext::subentry>_>._M_impl.
      super__Vector_impl_data._0_16_ = ZEXT416(0) << 0x40;
      local_50._M_p = (pointer)&local_40;
      local_48 = 0;
      local_40._M_local_buf[0] = '\0';
      local_108._0_8_ = local_108 + 0x10;
      while( true ) {
        cVar1 = std::istream::get();
        if (cVar1 == '\0') break;
        std::__cxx11::string::push_back((char)(value_type *)local_108);
      }
      std::istream::read((char *)in,(long)(local_108 + 0x20));
      std::istream::read((char *)in,(long)(local_108 + 0x28));
      std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::push_back
                (&this->words_,(value_type *)local_108);
      uVar2 = find(this,(string *)local_108);
      (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar2] = iVar3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_p != &local_40) {
        operator_delete(local_50._M_p);
      }
      std::vector<fasttext::subentry,_std::allocator<fasttext::subentry>_>::~vector(&local_68);
      if ((undefined1 *)local_108._120_8_ != local_108 + 0x88) {
        operator_delete((void *)local_108._120_8_);
      }
      std::vector<fasttext::subentry,_std::allocator<fasttext::subentry>_>::~vector
                ((vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> *)
                 (local_108 + 0x60));
      std::vector<fasttext::subentry,_std::allocator<fasttext::subentry>_>::~vector
                ((vector<fasttext::subentry,_std::allocator<fasttext::subentry>_> *)
                 (local_108 + 0x48));
      if ((pointer)local_108._48_8_ != (pointer)0x0) {
        operator_delete((void *)local_108._48_8_);
      }
      if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
        operator_delete((void *)local_108._0_8_);
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 < this->size_);
  }
  initTableDiscard(this);
  initNgrams(this);
  return;
}

Assistant:

void Dictionary::load(std::istream& in) {
  words_.clear();
  for (int32_t i = 0; i < MAX_VOCAB_SIZE; i++) {
    word2int_[i] = -1;
  }
  in.read((char*) &size_, sizeof(int32_t));
  in.read((char*) &nwords_, sizeof(int32_t));
  in.read((char*) &nlabels_, sizeof(int32_t));
  in.read((char*) &ntokens_, sizeof(int64_t));
  for (int32_t i = 0; i < size_; i++) {
    char c;
    entry e;
    while ((c = in.get()) != 0) {
      e.word.push_back(c);
    }
    in.read((char*) &e.count, sizeof(int64_t));
    in.read((char*) &e.type, sizeof(entry_type));
    words_.push_back(e);
    word2int_[find(e.word)] = i;
  }
  initTableDiscard();
  initNgrams();
}